

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O1

pair<eastl::pair<int,_int>_*,_bool> __thiscall
eastl::vector_map<int,_int,_eastl::less<int>,_eastl::allocator>::insert
          (vector_map<int,_int,_eastl::less<int>,_eastl::allocator> *this,value_type *val)

{
  iterator ppVar1;
  iterator ppVar2;
  int iVar3;
  ulong uVar4;
  value_type *extraout_RDX;
  undefined8 uVar5;
  iterator position;
  ulong uVar6;
  ulong uVar7;
  pair<eastl::pair<int,_int>_*,_bool> pVar8;
  
  ppVar1 = (this->m_base).super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>.mpBegin;
  ppVar2 = (this->m_base).super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>.mpEnd;
  uVar4 = (long)ppVar2 - (long)ppVar1 >> 3;
  position = ppVar1;
  if (0 < (long)uVar4) {
    do {
      uVar6 = uVar4 >> 1;
      uVar7 = ~uVar6 + uVar4;
      uVar4 = uVar6;
      if (position[uVar6].first < val->first) {
        position = position + uVar6 + 1;
        uVar4 = uVar7;
      }
    } while (0 < (long)uVar4);
  }
  if ((position == ppVar2) || (val->first < position->first)) {
    if ((position == ppVar2) &&
       (ppVar2 != (this->m_base).super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>.
                  mpCapacity)) {
      (this->m_base).super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>.mpEnd = ppVar2 + 1;
      iVar3 = val->second;
      ppVar2->first = val->first;
      ppVar2->second = iVar3;
    }
    else {
      vector<eastl::pair<int,_int>,_eastl::allocator>::DoInsertValue(&this->m_base,position,val);
      val = extraout_RDX;
    }
    position = (iterator)
               ((long)position +
               ((long)(this->m_base).super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>.
                      mpBegin - (long)ppVar1));
    uVar5 = CONCAT71((int7)((ulong)val >> 8),1);
  }
  else {
    uVar5 = 0;
  }
  pVar8._8_8_ = uVar5;
  pVar8.first = position;
  return pVar8;
}

Assistant:

::eastl::pair<iterator, bool> insert(value_type const& val) {
    iterator const i(lower_bound(val.first));

    return (i == end() || m_cmp(val.first, i->first))
        ? ::eastl::make_pair(m_base.insert(i, val), true)
        : ::eastl::make_pair(i, false)
        ;
  }